

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O2

void __thiscall xLearn::RMSDMetricTest_rsmd_test_Test::TestBody(RMSDMetricTest_rsmd_test_Test *this)

{
  uint uVar1;
  ThreadPool *this_00;
  char *pcVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  undefined1 in_XMM2 [16];
  AssertHelper local_a0;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  RMSDMetric metric;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  undefined1 auVar6 [64];
  
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x40000000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x40000000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x40000000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x40000000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&Y,(float *)&metric);
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(metric.super_Metric._vptr_Metric._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::emplace_back<float>(&pred,(float *)&metric);
  metric.super_Metric._vptr_Metric = (_func_int **)&PTR__Metric_001713d0;
  metric.error_ = 0.0;
  metric.total_example_ = 0;
  uVar1 = std::thread::hardware_concurrency();
  auVar6._8_56_ = extraout_var;
  auVar6._0_8_ = extraout_XMM1_Qa;
  auVar4 = auVar6._0_16_;
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar1);
  Metric::Initialize(&metric.super_Metric,this_00);
  RMSDMetric::Accumulate(&metric,&Y,&pred);
  auVar4 = vcvtusi2ss_avx512f(auVar4,metric.total_example_);
  auVar4._0_4_ = metric.error_ / auVar4._0_4_;
  auVar4._4_12_ = SUB6012((undefined1  [60])0x0,0);
  if (auVar4._0_4_ < 0.0) {
    fVar3 = sqrtf(auVar4._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar4,auVar4);
    fVar3 = auVar4._0_4_;
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"metric_val","1.0",fVar3,1.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0x109,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  metric.error_ = 0.0;
  metric.total_example_ = 0;
  *Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       23.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[1] =
       23.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[2] =
       23.0;
  Y.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[3] =
       23.0;
  *pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[1]
       = 12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[2]
       = 12.0;
  pred.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start[3]
       = 12.0;
  RMSDMetric::Accumulate(&metric,&Y,&pred);
  auVar4 = vcvtusi2ss_avx512f(in_XMM2,metric.total_example_);
  auVar5._0_4_ = metric.error_ / auVar4._0_4_;
  auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
  if (auVar5._0_4_ < 0.0) {
    fVar3 = sqrtf(auVar5._0_4_);
  }
  else {
    auVar4 = vsqrtss_avx(auVar5,auVar5);
    fVar3 = auVar4._0_4_;
  }
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&gtest_ar,"metric_val","sqrt(121)",fVar3,11.0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  RMSDMetric::metric_type_abi_cxx11_((string *)&gtest_ar,&metric);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)&gtest_ar_2,"metric.metric_type()","\"RMSD\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
             (char (*) [5])"RMSD");
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&pred.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&Y.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

TEST(RecallMetricTest, recall_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  RecallMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 2.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (1.0 / 2.0));
  EXPECT_EQ(metric.metric_type(), "Recall");
}